

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_group_delay.cc
# Opt level: O1

bool __thiscall
sptk::FilterCoefficientsToGroupDelay::Run
          (FilterCoefficientsToGroupDelay *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *group_delay,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  pointer pdVar5;
  uint uVar6;
  pointer pdVar7;
  double *pdVar8;
  uint uVar9;
  size_type __new_size;
  ulong uVar10;
  pointer pdVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  
  if ((this->is_valid_ == true) &&
     ((long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 == (long)this->num_numerator_order_ + 1)) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (group_delay == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if ((long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3 !=
        (long)this->num_denominator_order_ + 1) {
      return false;
    }
    iVar1 = this->fft_length_;
    uVar6 = iVar1 / 2 + 1;
    if ((long)(group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)(int)uVar6) {
      std::vector<double,_std::allocator<double>_>::resize(group_delay,(long)(int)uVar6);
    }
    this_00 = &buffer->real_part1_;
    if ((long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(long)this->fft_length_);
    }
    this_02 = &buffer->real_part2_;
    if ((long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->fft_length_) {
      std::vector<double,_std::allocator<double>_>::resize(this_02,(long)this->fft_length_);
    }
    this_01 = &buffer->flipped_coefficients_;
    __new_size = (long)this->num_denominator_order_ + 1;
    if ((long)(buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
    }
    pdVar7 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    pdVar5 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
             .super__Vector_impl_data._M_start + 1;
    if (pdVar7 != pdVar5) {
      pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pdVar2 = pdVar7 + -1;
        pdVar7 = pdVar7 + -1;
        *pdVar8 = *pdVar2;
        pdVar8 = pdVar8 + 1;
      } while (pdVar7 != pdVar5);
    }
    (buffer->flipped_coefficients_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = 1.0;
    bVar4 = Perform1DConvolution(numerator_coefficients,this_01,&buffer->convolved_coefficients_);
    if (bVar4) {
      pdVar7 = (buffer->convolved_coefficients_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (buffer->convolved_coefficients_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = (long)pdVar5 - (long)pdVar7;
      if (uVar12 != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar7,uVar12);
      }
      pdVar2 = (buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar13 = (long)(uVar12 * 0x20000000) >> 0x1d;
      pdVar11 = (pointer)((long)(buffer->real_part1_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar13);
      if (pdVar11 != pdVar2) {
        memset(pdVar11,0,((long)pdVar2 + (-8 - (long)pdVar11) & 0xfffffffffffffff8U) + 8);
      }
      pdVar2 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (uint)((ulong)((long)pdVar5 - (long)pdVar7) >> 3);
      if (0 < (int)uVar9) {
        pdVar7 = (buffer->convolved_coefficients_).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar10 = 0;
        do {
          pdVar2[uVar10] = (double)(int)uVar10 * pdVar7[uVar10];
          uVar10 = uVar10 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar10);
      }
      pdVar7 = (buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar2 + (int)(uVar12 >> 3) != pdVar7) {
        memset(pdVar2 + (int)(uVar12 >> 3),0,
               ((long)pdVar7 + (-8 - (lVar13 + (long)pdVar2)) & 0xfffffffffffffff8U) + 8);
      }
      bVar4 = RealValuedFastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,&buffer->imag_part1_,
                         &buffer->buffer_for_fast_fourier_transform_);
      if (bVar4) {
        bVar4 = RealValuedFastFourierTransform::Run
                          (&this->fast_fourier_transform_,this_02,&buffer->imag_part2_,
                           &buffer->buffer_for_fast_fourier_transform_);
        if (bVar4) {
          if (iVar1 < -1) {
            return true;
          }
          pdVar7 = (group_delay->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar11 = (buffer->imag_part1_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (buffer->imag_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar12 = 0;
          do {
            dVar15 = pdVar5[uVar12];
            dVar14 = pdVar11[uVar12];
            dVar14 = dVar15 * dVar15 + dVar14 * dVar14;
            dVar15 = this->gamma_;
            if ((dVar15 != 1.0) || (NAN(dVar15))) {
              dVar14 = pow(dVar14,dVar15);
            }
            dVar14 = (pdVar5[uVar12] * pdVar2[uVar12] + pdVar11[uVar12] * pdVar3[uVar12]) / dVar14 -
                     (double)this->num_denominator_order_;
            pdVar7[uVar12] = dVar14;
            dVar15 = this->alpha_;
            if ((dVar15 != 1.0) || (NAN(dVar15))) {
              if (dVar14 <= 0.0) {
                dVar15 = pow(-dVar14,dVar15);
                dVar15 = -dVar15;
              }
              else {
                dVar15 = pow(dVar14,dVar15);
              }
              pdVar7[uVar12] = dVar15;
            }
            uVar12 = uVar12 + 1;
          } while (uVar6 != uVar12);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToGroupDelay::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* group_delay,
    FilterCoefficientsToGroupDelay::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == group_delay || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (group_delay->size() != static_cast<std::size_t>(output_length)) {
    group_delay->resize(output_length);
  }
  if (buffer->real_part1_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part1_.resize(fft_length_);
  }
  if (buffer->real_part2_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part2_.resize(fft_length_);
  }
  if (buffer->flipped_coefficients_.size() !=
      static_cast<std::size_t>(num_denominator_order_ + 1)) {
    buffer->flipped_coefficients_.resize(num_denominator_order_ + 1);
  }

  std::reverse_copy(denominator_coefficients.begin() + 1,
                    denominator_coefficients.end(),
                    buffer->flipped_coefficients_.begin());
  buffer->flipped_coefficients_.back() = 1.0;

  if (!Perform1DConvolution(numerator_coefficients,
                            buffer->flipped_coefficients_,
                            &buffer->convolved_coefficients_)) {
    return false;
  }
  const int coefficients_length(
      static_cast<int>(buffer->convolved_coefficients_.size()));

  std::copy(buffer->convolved_coefficients_.begin(),
            buffer->convolved_coefficients_.end(), buffer->real_part1_.begin());
  std::fill(buffer->real_part1_.begin() + coefficients_length,
            buffer->real_part1_.end(), 0.0);

  // Make ramped polynomial.
  {
    const double* src(&buffer->convolved_coefficients_[0]);
    double* dst(&buffer->real_part2_[0]);
    for (int i(0); i < coefficients_length; ++i) {
      dst[i] = i * src[i];
    }
  }
  std::fill(buffer->real_part2_.begin() + coefficients_length,
            buffer->real_part2_.end(), 0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part1_, &buffer->imag_part1_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  if (!fast_fourier_transform_.Run(
          &buffer->real_part2_, &buffer->imag_part2_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  double* output(&((*group_delay)[0]));
  const double* xr(&buffer->real_part1_[0]);
  const double* yr(&buffer->real_part2_[0]);
  const double* xi(&buffer->imag_part1_[0]);
  const double* yi(&buffer->imag_part2_[0]);

  for (int i(0); i < output_length; ++i) {
    double denominator(xr[i] * xr[i] + xi[i] * xi[i]);
    if (1.0 != gamma_) {
      denominator = std::pow(denominator, gamma_);
    }
    double numerator(xr[i] * yr[i] + xi[i] * yi[i]);
    output[i] = numerator / denominator - num_denominator_order_;
    if (1.0 != alpha_) {
      output[i] = (0.0 < output[i]) ? std::pow(output[i], alpha_)
                                    : -std::pow(-output[i], alpha_);
    }
  }

  return true;
}